

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O1

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  string *psVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  long *plVar12;
  ostream *poVar13;
  ostream *poVar14;
  char **ppcVar15;
  double dVar16;
  Real RVar17;
  string reason;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_608;
  cpp_dec_float<50U,_int,_void> local_5c8;
  undefined1 local_588 [16];
  char *local_578;
  uint uStack_570;
  undefined3 uStack_56b;
  uint uStack_568;
  undefined8 uStack_563;
  undefined8 local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_528;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"");
  local_608.m_backend.fpclass = cpp_dec_float_finite;
  local_608.m_backend.prec_elem = 10;
  local_608.m_backend.data._M_elems[0] = 0;
  local_608.m_backend.data._M_elems[1] = 0;
  local_608.m_backend.data._M_elems[2] = 0;
  local_608.m_backend.data._M_elems[3] = 0;
  local_608.m_backend.data._M_elems[4] = 0;
  local_608.m_backend.data._M_elems[5] = 0;
  local_608.m_backend.data._M_elems[6] = 0;
  local_608.m_backend.data._M_elems[7] = 0;
  local_608.m_backend.data._M_elems[8] = 0;
  local_608.m_backend.data._M_elems[9] = 0;
  local_608.m_backend.exp = 0;
  local_608.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_608,0.0);
  local_428.m_backend.fpclass = cpp_dec_float_finite;
  local_428.m_backend.prec_elem = 10;
  local_428.m_backend.data._M_elems[0] = 0;
  local_428.m_backend.data._M_elems[1] = 0;
  local_428.m_backend.data._M_elems[2] = 0;
  local_428.m_backend.data._M_elems[3] = 0;
  local_428.m_backend.data._M_elems[4] = 0;
  local_428.m_backend.data._M_elems[5] = 0;
  local_428.m_backend.data._M_elems._24_5_ = 0;
  local_428.m_backend.data._M_elems[7]._1_3_ = 0;
  local_428.m_backend.data._M_elems._32_5_ = 0;
  local_428.m_backend.data._M_elems[9]._1_3_ = 0;
  local_428.m_backend.exp = 0;
  local_428.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_428,0.0);
  local_468.m_backend.fpclass = cpp_dec_float_finite;
  local_468.m_backend.prec_elem = 10;
  local_468.m_backend.data._M_elems[0] = 0;
  local_468.m_backend.data._M_elems[1] = 0;
  local_468.m_backend.data._M_elems[2] = 0;
  local_468.m_backend.data._M_elems[3] = 0;
  local_468.m_backend.data._M_elems[4] = 0;
  local_468.m_backend.data._M_elems[5] = 0;
  local_468.m_backend.data._M_elems._24_5_ = 0;
  local_468.m_backend.data._M_elems[7]._1_3_ = 0;
  local_468.m_backend.data._M_elems._32_5_ = 0;
  local_468.m_backend.data._M_elems[9]._1_3_ = 0;
  local_468.m_backend.exp = 0;
  local_468.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_468,0.0);
  local_4a8.m_backend.fpclass = cpp_dec_float_finite;
  local_4a8.m_backend.prec_elem = 10;
  local_4a8.m_backend.data._M_elems[0] = 0;
  local_4a8.m_backend.data._M_elems[1] = 0;
  local_4a8.m_backend.data._M_elems[2] = 0;
  local_4a8.m_backend.data._M_elems[3] = 0;
  local_4a8.m_backend.data._M_elems[4] = 0;
  local_4a8.m_backend.data._M_elems[5] = 0;
  local_4a8.m_backend.data._M_elems._24_5_ = 0;
  local_4a8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_4a8.m_backend.data._M_elems._32_5_ = 0;
  local_4a8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_4a8.m_backend.exp = 0;
  local_4a8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_4a8,0.0);
  local_4e8.m_backend.fpclass = cpp_dec_float_finite;
  local_4e8.m_backend.prec_elem = 10;
  local_4e8.m_backend.data._M_elems[0] = 0;
  local_4e8.m_backend.data._M_elems[1] = 0;
  local_4e8.m_backend.data._M_elems[2] = 0;
  local_4e8.m_backend.data._M_elems[3] = 0;
  local_4e8.m_backend.data._M_elems[4] = 0;
  local_4e8.m_backend.data._M_elems[5] = 0;
  local_4e8.m_backend.data._M_elems._24_5_ = 0;
  local_4e8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_4e8.m_backend.data._M_elems._32_5_ = 0;
  local_4e8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_4e8.m_backend.exp = 0;
  local_4e8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_4e8,0.0);
  local_a8.m_backend.fpclass = cpp_dec_float_finite;
  local_a8.m_backend.prec_elem = 10;
  local_a8.m_backend.data._M_elems[0] = 0;
  local_a8.m_backend.data._M_elems[1] = 0;
  local_a8.m_backend.data._M_elems[2] = 0;
  local_a8.m_backend.data._M_elems[3] = 0;
  local_a8.m_backend.data._M_elems[4] = 0;
  local_a8.m_backend.data._M_elems[5] = 0;
  local_a8.m_backend.data._M_elems._24_5_ = 0;
  local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_a8.m_backend.data._M_elems._32_5_ = 0;
  local_a8.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
  local_e8.m_backend.fpclass = cpp_dec_float_finite;
  local_e8.m_backend.prec_elem = 10;
  local_e8.m_backend.data._M_elems[0] = 0;
  local_e8.m_backend.data._M_elems[1] = 0;
  local_e8.m_backend.data._M_elems[2] = 0;
  local_e8.m_backend.data._M_elems[3] = 0;
  local_e8.m_backend.data._M_elems[4] = 0;
  local_e8.m_backend.data._M_elems[5] = 0;
  local_e8.m_backend.data._M_elems._24_5_ = 0;
  local_e8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_e8.m_backend.data._M_elems._32_5_ = 0;
  local_e8.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_e8,0.0);
  local_128.m_backend.fpclass = cpp_dec_float_finite;
  local_128.m_backend.prec_elem = 10;
  local_128.m_backend.data._M_elems[0] = 0;
  local_128.m_backend.data._M_elems[1] = 0;
  local_128.m_backend.data._M_elems[2] = 0;
  local_128.m_backend.data._M_elems[3] = 0;
  local_128.m_backend.data._M_elems[4] = 0;
  local_128.m_backend.data._M_elems[5] = 0;
  local_128.m_backend.data._M_elems._24_5_ = 0;
  local_128.m_backend.data._M_elems[7]._1_3_ = 0;
  local_128.m_backend.data._M_elems._32_5_ = 0;
  local_128.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
  local_168.m_backend.fpclass = cpp_dec_float_finite;
  local_168.m_backend.prec_elem = 10;
  local_168.m_backend.data._M_elems[0] = 0;
  local_168.m_backend.data._M_elems[1] = 0;
  local_168.m_backend.data._M_elems[2] = 0;
  local_168.m_backend.data._M_elems[3] = 0;
  local_168.m_backend.data._M_elems[4] = 0;
  local_168.m_backend.data._M_elems[5] = 0;
  local_168.m_backend.data._M_elems._24_5_ = 0;
  local_168.m_backend.data._M_elems[7]._1_3_ = 0;
  local_168.m_backend.data._M_elems._32_5_ = 0;
  local_168.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
  local_5c8.fpclass = cpp_dec_float_finite;
  local_5c8.prec_elem = 10;
  local_5c8.data._M_elems[0] = 0;
  local_5c8.data._M_elems[1] = 0;
  local_5c8.data._M_elems[2] = 0;
  local_5c8.data._M_elems[3] = 0;
  local_5c8.data._M_elems[4] = 0;
  local_5c8.data._M_elems[5] = 0;
  local_5c8.data._M_elems._24_5_ = 0;
  local_5c8.data._M_elems[7]._1_3_ = 0;
  local_5c8.data._M_elems._32_5_ = 0;
  local_5c8.data._M_elems[9]._1_3_ = 0;
  local_5c8.exp = 0;
  local_5c8.neg = false;
  poVar14 = (soplex->spxout).m_streams[3];
  psVar1 = &this->validatesolution;
  iVar11 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar11 == 0) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_5c8,
               soplex->_currentSettings->_realParamValues[6]);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar11 == 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_5c8,
                 -soplex->_currentSettings->_realParamValues[6]);
    }
    else {
      dVar16 = atof((psVar1->_M_dataplus)._M_p);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_5c8,dVar16);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_588,soplex);
  local_1a8.data._M_elems[0] = local_5c8.data._M_elems[0];
  local_1a8.data._M_elems[1] = local_5c8.data._M_elems[1];
  local_1a8.data._M_elems[2] = local_5c8.data._M_elems[2];
  local_1a8.data._M_elems[3] = local_5c8.data._M_elems[3];
  local_1a8.data._M_elems[4] = local_5c8.data._M_elems[4];
  local_1a8.data._M_elems[5] = local_5c8.data._M_elems[5];
  local_1a8.data._M_elems[6] = local_5c8.data._M_elems[6];
  local_1a8.data._M_elems[7] =
       (uint)(CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_) >> 0x20);
  local_1a8.data._M_elems[8] = local_5c8.data._M_elems[8];
  local_1a8.data._M_elems[9] =
       (uint)(CONCAT35(local_5c8.data._M_elems[9]._1_3_,local_5c8.data._M_elems._32_5_) >> 0x20);
  local_1a8.exp = local_5c8.exp;
  local_1a8.neg = local_5c8.neg;
  local_1a8.fpclass = local_5c8.fpclass;
  local_1a8.prec_elem = local_5c8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&local_1a8,(cpp_dec_float<50U,_int,_void> *)local_588);
  local_608.m_backend.neg = local_1a8.neg;
  if (local_1a8.neg == true) {
    local_608.m_backend.neg =
         local_1a8.fpclass == cpp_dec_float_finite && local_1a8.data._M_elems[0] == 0;
  }
  local_608.m_backend.data._M_elems[0] = local_1a8.data._M_elems[0];
  local_608.m_backend.data._M_elems[1] = local_1a8.data._M_elems[1];
  local_608.m_backend.data._M_elems[2] = local_1a8.data._M_elems[2];
  local_608.m_backend.data._M_elems[3] = local_1a8.data._M_elems[3];
  local_608.m_backend.data._M_elems[4] = local_1a8.data._M_elems[4];
  local_608.m_backend.data._M_elems[5] = local_1a8.data._M_elems[5];
  local_608.m_backend.data._M_elems[6] = local_1a8.data._M_elems[6];
  local_608.m_backend.data._M_elems[7] = local_1a8.data._M_elems[7];
  local_608.m_backend.data._M_elems[8] = local_1a8.data._M_elems[8];
  local_608.m_backend.data._M_elems[9] = local_1a8.data._M_elems[9];
  local_608.m_backend.exp = local_1a8.exp;
  local_608.m_backend.fpclass = local_1a8.fpclass;
  local_608.m_backend.prec_elem = local_1a8.prec_elem;
  if (soplex->_status != INForUNBD) goto LAB_0033e8c0;
  if ((local_5c8.fpclass == cpp_dec_float_NaN) ||
     (dVar16 = soplex->_currentSettings->_realParamValues[6], NAN(dVar16))) {
LAB_0033e859:
    if ((local_5c8.fpclass == cpp_dec_float_NaN) ||
       (dVar16 = soplex->_currentSettings->_realParamValues[6], NAN(dVar16))) goto LAB_0033e8c0;
    local_558._0_4_ = cpp_dec_float_finite;
    local_558._4_4_ = 10;
    local_588._0_8_ = (char **)0x0;
    local_588._8_8_ = 0;
    local_578 = (char *)0x0;
    _uStack_570 = 0;
    uStack_56b = 0;
    _uStack_568 = 0;
    uStack_563 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_588,-dVar16);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_5c8,(cpp_dec_float<50U,_int,_void> *)local_588);
    if (iVar11 != 0) goto LAB_0033e8c0;
  }
  else {
    local_558._0_4_ = cpp_dec_float_finite;
    local_558._4_4_ = 10;
    local_588._0_8_ = (char **)0x0;
    local_588._8_8_ = 0;
    local_578 = (char *)0x0;
    _uStack_570 = 0;
    uStack_56b = 0;
    _uStack_568 = 0;
    uStack_563 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_588,dVar16);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_5c8,(cpp_dec_float<50U,_int,_void> *)local_588);
    if (iVar11 != 0) goto LAB_0033e859;
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_608,0.0);
LAB_0033e8c0:
  local_528.m_backend.data._M_elems[9] = local_608.m_backend.data._M_elems[9];
  local_528.m_backend.data._M_elems[8] = local_608.m_backend.data._M_elems[8];
  local_528.m_backend.data._M_elems[2] = local_608.m_backend.data._M_elems[2];
  local_528.m_backend.data._M_elems[1] = local_608.m_backend.data._M_elems[1];
  local_528.m_backend.data._M_elems[5] = local_608.m_backend.data._M_elems[5];
  local_528.m_backend.data._M_elems[4] = local_608.m_backend.data._M_elems[4];
  local_528.m_backend.data._M_elems[7] = local_608.m_backend.data._M_elems[7];
  local_528.m_backend.data._M_elems[6] = local_608.m_backend.data._M_elems[6];
  local_528.m_backend.data._M_elems[0] = local_608.m_backend.data._M_elems[0];
  local_528.m_backend.data._M_elems[3] = local_608.m_backend.data._M_elems[3];
  local_528.m_backend.exp = local_608.m_backend.exp;
  local_528.m_backend.neg = local_608.m_backend.neg;
  local_528.m_backend.fpclass = local_608.m_backend.fpclass;
  local_528.m_backend.prec_elem = local_608.m_backend.prec_elem;
  local_1e8.m_backend.fpclass = cpp_dec_float_finite;
  local_1e8.m_backend.prec_elem = 10;
  local_1e8.m_backend.data._M_elems[0] = 0;
  local_1e8.m_backend.data._M_elems[1] = 0;
  local_1e8.m_backend.data._M_elems[2] = 0;
  local_1e8.m_backend.data._M_elems[3] = 0;
  local_1e8.m_backend.data._M_elems[4] = 0;
  local_1e8.m_backend.data._M_elems[5] = 0;
  local_1e8.m_backend.data._M_elems._24_5_ = 0;
  local_1e8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_1e8.m_backend.data._M_elems._32_5_ = 0;
  local_1e8.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1e8,0.0);
  local_68.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)(this->validatetolerance).m_backend.data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
  local_68.m_backend.exp = (this->validatetolerance).m_backend.exp;
  local_68.m_backend.neg = (this->validatetolerance).m_backend.neg;
  local_68.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
  local_68.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
  bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_528,&local_1e8,&local_68);
  if (!bVar7) {
    std::__cxx11::string::append((char *)&local_628);
  }
  bVar7 = bVar7;
  if (soplex->_status == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(soplex,&local_428,&local_a8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(soplex,&local_468,&local_e8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation(soplex,&local_4a8,&local_128);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(soplex,&local_4e8,&local_168);
    pnVar2 = &this->validatetolerance;
    local_228.m_backend.data._M_elems[9]._1_3_ = local_428.m_backend.data._M_elems[9]._1_3_;
    local_228.m_backend.data._M_elems._32_5_ = local_428.m_backend.data._M_elems._32_5_;
    local_228.m_backend.data._M_elems[7]._1_3_ = local_428.m_backend.data._M_elems[7]._1_3_;
    local_228.m_backend.data._M_elems._24_5_ = local_428.m_backend.data._M_elems._24_5_;
    local_228.m_backend.data._M_elems[4] = local_428.m_backend.data._M_elems[4];
    local_228.m_backend.data._M_elems[5] = local_428.m_backend.data._M_elems[5];
    local_228.m_backend.data._M_elems[0] = local_428.m_backend.data._M_elems[0];
    local_228.m_backend.data._M_elems[1] = local_428.m_backend.data._M_elems[1];
    local_228.m_backend.data._M_elems[2] = local_428.m_backend.data._M_elems[2];
    local_228.m_backend.data._M_elems[3] = local_428.m_backend.data._M_elems[3];
    local_228.m_backend.exp = local_428.m_backend.exp;
    local_228.m_backend.neg = local_428.m_backend.neg;
    local_228.m_backend.fpclass = local_428.m_backend.fpclass;
    local_228.m_backend.prec_elem = local_428.m_backend.prec_elem;
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_268.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_268.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_268.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_268.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_268.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_268.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_228,&local_268,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_628);
    }
    local_2a8.m_backend.data._M_elems[9]._1_3_ = local_468.m_backend.data._M_elems[9]._1_3_;
    local_2a8.m_backend.data._M_elems._32_5_ = local_468.m_backend.data._M_elems._32_5_;
    local_2a8.m_backend.data._M_elems[7]._1_3_ = local_468.m_backend.data._M_elems[7]._1_3_;
    local_2a8.m_backend.data._M_elems._24_5_ = local_468.m_backend.data._M_elems._24_5_;
    local_2a8.m_backend.data._M_elems[4] = local_468.m_backend.data._M_elems[4];
    local_2a8.m_backend.data._M_elems[5] = local_468.m_backend.data._M_elems[5];
    local_2a8.m_backend.data._M_elems[0] = local_468.m_backend.data._M_elems[0];
    local_2a8.m_backend.data._M_elems[1] = local_468.m_backend.data._M_elems[1];
    local_2a8.m_backend.data._M_elems[2] = local_468.m_backend.data._M_elems[2];
    local_2a8.m_backend.data._M_elems[3] = local_468.m_backend.data._M_elems[3];
    local_2a8.m_backend.exp = local_468.m_backend.exp;
    local_2a8.m_backend.neg = local_468.m_backend.neg;
    local_2a8.m_backend.fpclass = local_468.m_backend.fpclass;
    local_2a8.m_backend.prec_elem = local_468.m_backend.prec_elem;
    local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_2e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_2e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_2e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_2e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_2e8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_2e8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_2e8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_2e8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar9 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_2a8,&local_2e8,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar9) {
      std::__cxx11::string::append((char *)&local_628);
    }
    local_328.m_backend.data._M_elems[9]._1_3_ = local_4a8.m_backend.data._M_elems[9]._1_3_;
    local_328.m_backend.data._M_elems._32_5_ = local_4a8.m_backend.data._M_elems._32_5_;
    local_328.m_backend.data._M_elems[7]._1_3_ = local_4a8.m_backend.data._M_elems[7]._1_3_;
    local_328.m_backend.data._M_elems._24_5_ = local_4a8.m_backend.data._M_elems._24_5_;
    local_328.m_backend.data._M_elems[4] = local_4a8.m_backend.data._M_elems[4];
    local_328.m_backend.data._M_elems[5] = local_4a8.m_backend.data._M_elems[5];
    local_328.m_backend.data._M_elems[0] = local_4a8.m_backend.data._M_elems[0];
    local_328.m_backend.data._M_elems[1] = local_4a8.m_backend.data._M_elems[1];
    local_328.m_backend.data._M_elems[2] = local_4a8.m_backend.data._M_elems[2];
    local_328.m_backend.data._M_elems[3] = local_4a8.m_backend.data._M_elems[3];
    local_328.m_backend.exp = local_4a8.m_backend.exp;
    local_328.m_backend.neg = local_4a8.m_backend.neg;
    local_328.m_backend.fpclass = local_4a8.m_backend.fpclass;
    local_328.m_backend.prec_elem = local_4a8.m_backend.prec_elem;
    local_368.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_368.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_368.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_368.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_368.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_368.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_368.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_368.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_368.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar10 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_328,&local_368,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar10) {
      std::__cxx11::string::append((char *)&local_628);
    }
    bVar7 = bVar10 && (bVar9 && (bVar8 && bVar7));
    local_3a8.m_backend.data._M_elems[9]._1_3_ = local_4e8.m_backend.data._M_elems[9]._1_3_;
    local_3a8.m_backend.data._M_elems._32_5_ = local_4e8.m_backend.data._M_elems._32_5_;
    local_3a8.m_backend.data._M_elems[7]._1_3_ = local_4e8.m_backend.data._M_elems[7]._1_3_;
    local_3a8.m_backend.data._M_elems._24_5_ = local_4e8.m_backend.data._M_elems._24_5_;
    local_3a8.m_backend.data._M_elems[4] = local_4e8.m_backend.data._M_elems[4];
    local_3a8.m_backend.data._M_elems[5] = local_4e8.m_backend.data._M_elems[5];
    local_3a8.m_backend.data._M_elems[0] = local_4e8.m_backend.data._M_elems[0];
    local_3a8.m_backend.data._M_elems[1] = local_4e8.m_backend.data._M_elems[1];
    local_3a8.m_backend.data._M_elems[2] = local_4e8.m_backend.data._M_elems[2];
    local_3a8.m_backend.data._M_elems[3] = local_4e8.m_backend.data._M_elems[3];
    local_3a8.m_backend.exp = local_4e8.m_backend.exp;
    local_3a8.m_backend.neg = local_4e8.m_backend.neg;
    local_3a8.m_backend.fpclass = local_4e8.m_backend.fpclass;
    local_3a8.m_backend.prec_elem = local_4e8.m_backend.prec_elem;
    local_3e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_3e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_3e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_3e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_3e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_3e8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_3e8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_3e8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_3e8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_3a8,&local_3e8,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_628);
      bVar7 = false;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Validation          :",0x15);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," Success\n",9);
  }
  else {
    local_628._M_dataplus._M_p[local_628._M_string_length - 2] = ']';
    std::operator+(&local_548," Fail [",&local_628);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_548);
    ppcVar15 = (char **)(plVar12 + 2);
    if ((char **)*plVar12 == ppcVar15) {
      local_578 = *ppcVar15;
      _uStack_570 = (undefined5)plVar12[3];
      uStack_56b = (undefined3)((ulong)plVar12[3] >> 0x28);
      local_588._0_8_ = &local_578;
    }
    else {
      local_578 = *ppcVar15;
      local_588._0_8_ = (char **)*plVar12;
    }
    local_588._8_8_ = plVar12[1];
    *plVar12 = (long)ppcVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,(char *)local_588._0_8_,local_588._8_8_);
    if ((char **)local_588._0_8_ != &local_578) {
      operator_delete((void *)local_588._0_8_,(ulong)(local_578 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != &local_548.field_2) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Objective        : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_608);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Bound            : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_428);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Row              : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_468);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Reduced Cost     : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_4a8);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Dual             : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar14 = boost::multiprecision::operator<<(poVar14,&local_4e8);
  *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
       *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}